

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,char *fn)

{
  YSRESULT YVar1;
  FILE *__stream;
  
  printf("Loading %s\n");
  __stream = fopen(fn,"rb");
  if (__stream == (FILE *)0x0) {
    YVar1 = YSERR;
  }
  else {
    YVar1 = LoadWav(this,(FILE *)__stream);
    fclose(__stream);
  }
  return YVar1;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(const char fn[])
{
	FILE *fp;
	printf("Loading %s\n",fn);
	fp=fopen(fn,"rb");
	if(fp!=NULL)
	{
		auto res=LoadWav(fp);
		fclose(fp);
		return res;
	}
	return YSERR;
}